

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O2

cmJSONHelper<cm::optional<FilterOptions>_> * __thiscall
cmJSONHelperBuilder::
Optional<cmCMakePresetsGraph::TestPreset::FilterOptions,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::FilterOptions>>
          (cmJSONHelper<cm::optional<FilterOptions>_> *__return_storage_ptr__,
          cmJSONHelperBuilder *this,Object<cmCMakePresetsGraph::TestPreset::FilterOptions> *func)

{
  Object<cmCMakePresetsGraph::TestPreset::FilterOptions> OStack_58;
  
  Object<cmCMakePresetsGraph::TestPreset::FilterOptions>::Object
            (&OStack_58,(Object<cmCMakePresetsGraph::TestPreset::FilterOptions> *)this);
  std::
  function<bool(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)>
  ::
  function<cmJSONHelperBuilder::Optional<cmCMakePresetsGraph::TestPreset::FilterOptions,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::FilterOptions>>(cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::FilterOptions>)::_lambda(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)>
              *)__return_storage_ptr__,(anon_class_72_1_898bcfc2 *)&OStack_58);
  Object<cmCMakePresetsGraph::TestPreset::FilterOptions>::~Object(&OStack_58);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<cm::optional<T>> Optional(F func)
  {
    return [func](cm::optional<T>& out, const Json::Value* value,
                  cmJSONState* state) -> bool {
      if (!value) {
        out.reset();
        return true;
      }
      out.emplace();
      return func(*out, value, state);
    };
  }